

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounded_queue_impl.h
# Opt level: O0

bool __thiscall
lwlog::details::
bounded_queue<1024UL,_lwlog::asynchronous_policy<lwlog::block_overflow_policy,_1024UL,_18446744073709551615UL>::backend<lwlog::configuration<lwlog::disable_local_time,_lwlog::disable_thread_id,_lwlog::disable_process_id,_lwlog::disable_topics>,_lwlog::spsc_model_policy>::queue_item,_lwlog::block_overflow_policy,_lwlog::spsc_model_policy>
::is_empty(bounded_queue<1024UL,_lwlog::asynchronous_policy<lwlog::block_overflow_policy,_1024UL,_18446744073709551615UL>::backend<lwlog::configuration<lwlog::disable_local_time,_lwlog::disable_thread_id,_lwlog::disable_process_id,_lwlog::disable_topics>,_lwlog::spsc_model_policy>::queue_item,_lwlog::block_overflow_policy,_lwlog::spsc_model_policy>
           *this)

{
  __int_type_conflict _Var1;
  bounded_queue<1024UL,_lwlog::asynchronous_policy<lwlog::block_overflow_policy,_1024UL,_18446744073709551615UL>::backend<lwlog::configuration<lwlog::disable_local_time,_lwlog::disable_thread_id,_lwlog::disable_process_id,_lwlog::disable_topics>,_lwlog::spsc_model_policy>::queue_item,_lwlog::block_overflow_policy,_lwlog::spsc_model_policy>
  *this_local;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  _Var1 = (this->m_read_index).super___atomic_base<unsigned_long>._M_i;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return _Var1 == (this->m_write_index).super___atomic_base<unsigned_long>._M_i;
}

Assistant:

bool bounded_queue<Capacity, T, OverflowPolicy, ConcurrencyModelPolicy>::is_empty() const
    {
        return m_read_index.load(std::memory_order_relaxed) 
            == m_write_index.load(std::memory_order_relaxed);
    }